

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splayinsert(timeval i,Curl_tree *t,Curl_tree *node)

{
  long lVar1;
  Curl_tree *pCVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = i.tv_usec;
  lVar4 = i.tv_sec;
  if (node == (Curl_tree *)0x0) {
    return t;
  }
  if (t == (Curl_tree *)0x0) {
    pCVar2 = (Curl_tree *)0x0;
  }
  else {
    pCVar2 = Curl_splay(i,t);
    if (((pCVar2->key).tv_sec == lVar4) && ((pCVar2->key).tv_usec == lVar3)) {
      *(undefined4 *)&(node->key).tv_sec = 0xffffffff;
      *(undefined4 *)((long)&(node->key).tv_sec + 4) = 0xffffffff;
      *(undefined4 *)&(node->key).tv_usec = 0xffffffff;
      *(undefined4 *)((long)&(node->key).tv_usec + 4) = 0xffffffff;
      node->samen = pCVar2;
      node->samep = pCVar2->samep;
      pCVar2->samep->samen = node;
      goto LAB_00509da3;
    }
  }
  if (pCVar2 == (Curl_tree *)0x0) {
    node->smaller = (Curl_tree *)0x0;
    node->larger = (Curl_tree *)0x0;
  }
  else {
    lVar1 = (pCVar2->key).tv_sec;
    if ((lVar4 < lVar1) || ((lVar4 <= lVar1 && (lVar3 < (pCVar2->key).tv_usec)))) {
      node->smaller = pCVar2->smaller;
      node->larger = pCVar2;
      pCVar2->smaller = (Curl_tree *)0x0;
    }
    else {
      node->larger = pCVar2->larger;
      node->smaller = pCVar2;
      pCVar2->larger = (Curl_tree *)0x0;
    }
  }
  (node->key).tv_sec = lVar4;
  (node->key).tv_usec = lVar3;
  node->samen = node;
  pCVar2 = node;
LAB_00509da3:
  pCVar2->samep = node;
  return pCVar2;
}

Assistant:

struct Curl_tree *Curl_splayinsert(struct timeval i,
                                   struct Curl_tree *t,
                                   struct Curl_tree *node)
{
  static const struct timeval KEY_NOTUSED = {-1, -1}; /* will *NEVER* appear */

  if(node == NULL)
    return t;

  if(t != NULL) {
    t = Curl_splay(i, t);
    if(compare(i, t->key)==0) {
      /* There already exists a node in the tree with the very same key. Build
         a doubly-linked circular list of nodes. We add the new 'node' struct
         to the end of this list. */

      node->key = KEY_NOTUSED; /* we set the key in the sub node to NOTUSED
                               to quickly identify this node as a subnode */
      node->samen = t;
      node->samep = t->samep;
      t->samep->samen = node;
      t->samep = node;

      return t; /* the root node always stays the same */
    }
  }

  if(t == NULL) {
    node->smaller = node->larger = NULL;
  }
  else if(compare(i, t->key) < 0) {
    node->smaller = t->smaller;
    node->larger = t;
    t->smaller = NULL;

  }
  else {
    node->larger = t->larger;
    node->smaller = t;
    t->larger = NULL;
  }
  node->key = i;

  /* no identical nodes (yet), we are the only one in the list of nodes */
  node->samen = node;
  node->samep = node;
  return node;
}